

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O1

void __thiscall
Glucose::SharedCompanion::addLearnt(SharedCompanion *this,ParallelSolver *s,Lit unary)

{
  Lit local_1c;
  
  local_1c.x = unary.x;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutexSharedUnitCompanion);
  if (((this->isUnary).data[local_1c.x >> 1].value & 2) != 0) {
    vec<Glucose::Lit>::push(&this->unitLit,&local_1c);
    (this->isUnary).data[local_1c.x >> 1].value = (byte)local_1c.x & 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutexSharedUnitCompanion);
  return;
}

Assistant:

void SharedCompanion::addLearnt(ParallelSolver *s,Lit unary) {
  pthread_mutex_lock(&mutexSharedUnitCompanion);
  if (isUnary[var(unary)]==l_Undef) {
      unitLit.push(unary);
      isUnary[var(unary)] = sign(unary)?l_False:l_True;
  } 
  pthread_mutex_unlock(&mutexSharedUnitCompanion);
}